

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRAnalogEvent.cpp
# Opt level: O0

float __thiscall MinVR::VRAnalogEvent::getValue(VRAnalogEvent *this)

{
  byte bVar1;
  undefined8 uVar2;
  long in_RDI;
  VRFloat VVar3;
  string *in_stack_00000008;
  int *in_stack_00000010;
  string *in_stack_00000018;
  string *in_stack_00000020;
  string *in_stack_00000028;
  VRError *in_stack_00000030;
  bool in_stack_00000057;
  string *in_stack_00000058;
  string *in_stack_00000060;
  VRDataIndex *in_stack_00000068;
  VRDataIndex *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *__a;
  char *in_stack_fffffffffffffe38;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined1 in_stack_fffffffffffffe6f;
  string *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  VRDataIndex *in_stack_fffffffffffffe80;
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [32];
  VRDatum_conflict *local_70;
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
             ,in_stack_fffffffffffffe30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38
             ,in_stack_fffffffffffffe30);
  bVar1 = VRDataIndex::exists(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                              in_stack_fffffffffffffe70,(bool)in_stack_fffffffffffffe6f);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  if ((bVar1 & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0xa8);
    VRDataIndex::getName_abi_cxx11_(in_stack_fffffffffffffdf8);
    std::operator+((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::operator+(in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_fffffffffffffe40),in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    VRError::VRError(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018,
                     in_stack_00000010,in_stack_00000008);
    __cxa_throw(uVar2,&VRError::typeinfo,VRError::~VRError);
  }
  __a = *(allocator<char> **)(in_RDI + 8);
  __s = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffe40),(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(bVar1,in_stack_fffffffffffffe40),(char *)__s,__a);
  local_70 = (VRDatum_conflict *)
             VRDataIndex::getValue
                       (in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000057);
  VVar3 = VRDatumConverter::operator_cast_to_float((VRDatumConverter<MinVR::VRDatum> *)0x17fedd);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  return VVar3;
}

Assistant:

float VRAnalogEvent::getValue() const {
    if (_index.exists("AnalogValue")) {
        return _index.getValue("AnalogValue");
    }
    else {
        VRERROR("VRAnalogEvent::getValue() cannot determine a data field to return for event named " +
                _index.getName() + ".", "Analog events should have an entry in their data index called AnalogValue.");
        return 0.0f;
    }
}